

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormatrix_p.h
# Opt level: O1

bool operator==(QColorVector *lhs,QColorVector *rhs)

{
  if (((ABS(lhs->x - rhs->x) < 0.00048828125) && (ABS(lhs->y - rhs->y) < 0.00048828125)) &&
     (ABS(lhs->z - rhs->z) < 0.00048828125)) {
    return ABS(lhs->w - rhs->w) < 0.00048828125;
  }
  return false;
}

Assistant:

inline bool comparesEqual(const QColorVector &v1, const QColorVector &v2) noexcept
{
    return (std::abs(v1.x - v2.x) < (1.0f / 2048.0f))
        && (std::abs(v1.y - v2.y) < (1.0f / 2048.0f))
        && (std::abs(v1.z - v2.z) < (1.0f / 2048.0f))
        && (std::abs(v1.w - v2.w) < (1.0f / 2048.0f));
}